

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void set_mimic_blocking(void)

{
  monst *pmVar1;
  
  pmVar1 = (monst *)&level->monlist;
LAB_00169d97:
  do {
    do {
      pmVar1 = pmVar1->nmon;
      if (pmVar1 == (monst *)0x0) {
        return;
      }
    } while ((pmVar1->mhp < 1) || ((pmVar1->field_0x60 & 2) == 0));
    if (pmVar1->m_ap_type == '\x02') goto LAB_00169dc6;
  } while ((pmVar1->m_ap_type != '\x01') || (1 < pmVar1->mappearance - 0x1b));
  goto LAB_00169dcf;
LAB_00169dc6:
  if (pmVar1->mappearance == 0x214) {
LAB_00169dcf:
    if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      unblock_point((int)pmVar1->mx,(int)pmVar1->my);
    }
    else {
      block_point((int)pmVar1->mx,(int)pmVar1->my);
    }
  }
  goto LAB_00169d97;
}

Assistant:

void set_mimic_blocking(void)
{
    struct monst *mon;

    for (mon = level->monlist; mon; mon = mon->nmon) {
	if (DEADMONSTER(mon)) continue;
	if (mon->minvis &&
	   ((mon->m_ap_type == M_AP_FURNITURE &&
	     (mon->mappearance == S_vcdoor || mon->mappearance == S_hcdoor)) ||
	    (mon->m_ap_type == M_AP_OBJECT && mon->mappearance == BOULDER))) {
	    if (See_invisible)
		block_point(mon->mx, mon->my);
	    else
		unblock_point(mon->mx, mon->my);
	}
    }
}